

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O3

void __thiscall reverselock_tests::reverselock_basics::test_method(reverselock_basics *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Mutex mutex;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  reverse_lock revlock4;
  check_type cVar3;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  assertion_result local_160;
  char **local_148;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  __native_type local_d8;
  unique_lock<std::mutex> local_a8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  _Alloc_hider local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._M_device = (mutex_type *)&local_d8;
  local_d8._16_8_ = 0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__align = 0;
  local_d8._8_8_ = 0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_a8);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x13;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_a8._M_owns;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80._M_p = (pointer)&local_140;
  local_140._0_8_ = "lock.owns_lock()";
  local_140.m_message.px = (element_type *)0xec5a65;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_100 = "";
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_98,1,0,WARN,_cVar3,(size_t)&local_108,0x13);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  pvVar1 = (iterator)0x15;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            ((reverse_lock *)local_98,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_a8,"lock",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x15);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_140._0_8_ = CONCAT71(local_140._1_7_,local_a8._M_owns) ^ 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148 = &local_170;
  local_170 = "!lock.owns_lock()";
  local_168 = "";
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_178 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_160,1,0,WARN,_cVar3,(size_t)&local_180,0x16);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock((reverse_lock *)local_98);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000018;
  file_01.m_begin = (iterator)&local_190;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a0,
             msg_01);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_a8._M_owns;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ = "lock.owns_lock()";
  local_140.m_message.px = (element_type *)0xec5a65;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80._M_p = (pointer)&local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_98,1,0,WARN,0xec59dd,(size_t)&stack0xfffffffffffffe50,
             0x18);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_basics)
{
    Mutex mutex;
    WAIT_LOCK(mutex, lock);

    BOOST_CHECK(lock.owns_lock());
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
}